

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# device.c
# Opt level: O0

void device1(void *arg)

{
  int sock;
  int sock_00;
  int iVar1;
  bool bVar2;
  int devb;
  int deva;
  int rc;
  void *arg_local;
  
  sock = test_socket_impl("/workspace/llm4binary/github/license_all_cmakelists_25/Snaipe[P]nanomsg/tests/device.c"
                          ,0x2f,2,0x10);
  test_bind_impl("/workspace/llm4binary/github/license_all_cmakelists_25/Snaipe[P]nanomsg/tests/device.c"
                 ,0x30,sock,"inproc://a");
  sock_00 = test_socket_impl("/workspace/llm4binary/github/license_all_cmakelists_25/Snaipe[P]nanomsg/tests/device.c"
                             ,0x31,2,0x10);
  test_bind_impl("/workspace/llm4binary/github/license_all_cmakelists_25/Snaipe[P]nanomsg/tests/device.c"
                 ,0x32,sock_00,"inproc://b");
  iVar1 = nn_device(sock,sock_00);
  bVar2 = false;
  if (iVar1 < 0) {
    iVar1 = nn_errno();
    bVar2 = true;
    if (iVar1 != 0x9523dfd) {
      iVar1 = nn_errno();
      bVar2 = iVar1 == 9;
    }
  }
  if (bVar2) {
    test_close_impl("/workspace/llm4binary/github/license_all_cmakelists_25/Snaipe[P]nanomsg/tests/device.c"
                    ,0x39,sock_00);
    test_close_impl("/workspace/llm4binary/github/license_all_cmakelists_25/Snaipe[P]nanomsg/tests/device.c"
                    ,0x3a,sock);
    return;
  }
  fprintf(_stderr,"Assertion failed: %s (%s:%d)\n",
          "rc < 0 && (nn_errno () == ETERM || nn_errno () == EBADF)",
          "/workspace/llm4binary/github/license_all_cmakelists_25/Snaipe[P]nanomsg/tests/device.c",
          0x36);
  fflush(_stderr);
  nn_err_abort();
}

Assistant:

void device1 (NN_UNUSED void *arg)
{
    int rc;
    int deva;
    int devb;

    /*  Intialise the device sockets. */
    deva = test_socket (AF_SP_RAW, NN_PAIR);
    test_bind (deva, SOCKET_ADDRESS_A);
    devb = test_socket (AF_SP_RAW, NN_PAIR);
    test_bind (devb, SOCKET_ADDRESS_B);

    /*  Run the device. */
    rc = nn_device (deva, devb);
    nn_assert (rc < 0 && (nn_errno () == ETERM || nn_errno () == EBADF));

    /*  Clean up. */
    test_close (devb);
    test_close (deva);
}